

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall
cmState::Directory::SetProperty(Directory *this,string *prop,char *value,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  PointerType pBVar2;
  allocator local_41;
  string local_40;
  
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    if (value == (char *)0x0) {
      ClearIncludeDirectories(this);
      return;
    }
    std::__cxx11::string::string((string *)&local_40,value,&local_41);
    SetIncludeDirectories(this,&local_40,lfbt);
  }
  else {
    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar1) {
      if (value == (char *)0x0) {
        ClearCompileOptions(this);
        return;
      }
      std::__cxx11::string::string((string *)&local_40,value,&local_41);
      SetCompileOptions(this,&local_40,lfbt);
    }
    else {
      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
      if (!bVar1) {
        pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        cmPropertyMap::SetProperty(&pBVar2->Properties,prop,value);
        return;
      }
      if (value == (char *)0x0) {
        ClearCompileDefinitions(this);
        return;
      }
      std::__cxx11::string::string((string *)&local_40,value,&local_41);
      SetCompileDefinitions(this,&local_40,lfbt);
    }
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmState::Directory::SetProperty(const std::string& prop,
                                     const char* value,
                                     cmListFileBacktrace lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES")
    {
    if (!value)
      {
      this->ClearIncludeDirectories();
      return;
      }
    this->SetIncludeDirectories(value, lfbt);
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    if (!value)
      {
      this->ClearCompileOptions();
      return;
      }
    this->SetCompileOptions(value, lfbt);
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    if (!value)
      {
      this->ClearCompileDefinitions();
      return;
      }
    this->SetCompileDefinitions(value, lfbt);
    return;
    }

  this->DirectoryState->Properties.SetProperty(prop, value);
}